

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

size_t __thiscall
(anonymous_namespace)::ExprHasher::
VisitVarArg<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)66,(mp::expr::Kind)67>>
          (ExprHasher *this,
          BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)66,_(mp::expr::Kind)67>
          e)

{
  bool bVar1;
  iterator other;
  BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> seed;
  iterator end;
  iterator i;
  size_t hash;
  ExprIterator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_> *in_stack_ffffffffffffffa8;
  ExprBase in_stack_ffffffffffffffb0;
  BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)66,_(mp::expr::Kind)67>
  *in_stack_ffffffffffffffb8;
  BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)66,_(mp::expr::Kind)67>
  in_stack_ffffffffffffffc0;
  ExprBase e_00;
  ExprIterator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_> local_30 [3];
  size_t local_18;
  
  mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
  BasicExpr<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)66,(mp::expr::Kind)67>>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)in_stack_ffffffffffffffb8,
             in_stack_ffffffffffffffc0,
             (type_conflict)((ulong)in_stack_ffffffffffffffb0.impl_ >> 0x20));
  local_18 = anon_unknown.dwarf_9ead9::ExprHasher::Hash((Expr)in_stack_ffffffffffffffb0.impl_);
  local_30[0].ptr_ =
       (Impl **)mp::
                BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)66,_(mp::expr::Kind)67>
                ::begin((BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)66,_(mp::expr::Kind)67>
                         *)in_stack_ffffffffffffffa8);
  other = mp::
          BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)66,_(mp::expr::Kind)67>
          ::end(in_stack_ffffffffffffffb8);
  while( true ) {
    e_00.impl_ = (Impl *)other;
    bVar1 = mp::internal::ExprIterator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>::
            operator!=(local_30,(ExprIterator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>
                                 )other.ptr_);
    if (!bVar1) break;
    seed = mp::internal::ExprIterator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>::
           operator*(in_stack_ffffffffffffffa8);
    local_18 = HashCombine<(mp::expr::Kind)48,(mp::expr::Kind)69>
                         ((size_t)seed.super_ExprBase.impl_,
                          (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)e_00.impl_);
    mp::internal::ExprIterator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>::operator++
              (local_30);
  }
  return local_18;
}

Assistant:

size_t VisitVarArg(E e) {
    size_t hash = Hash(e);
    for (typename E::iterator i = e.begin(), end = e.end(); i != end; ++i)
      hash = HashCombine(hash, *i);
    return hash;
  }